

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PushMultiItemsWidths(int components,float w_full)

{
  ImVector<float> *this;
  ImGuiContext *pIVar1;
  float *v;
  int iVar2;
  float *pfVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float w_item_last;
  float w_item_one;
  
  pIVar1 = GImGui;
  fVar6 = (GImGui->Style).ItemInnerSpacing.x;
  fVar5 = (float)(int)((w_full - fVar6 * (float)(components + -1)) / (float)components);
  fVar7 = 1.0;
  if (1.0 <= fVar5) {
    fVar7 = fVar5;
  }
  fVar5 = (float)(int)(w_full - (fVar7 + fVar6) * (float)(components + -1));
  fVar6 = 1.0;
  if (1.0 <= fVar5) {
    fVar6 = fVar5;
  }
  _w_item_last = CONCAT44(fVar7,fVar6);
  this = &(GImGui->CurrentWindow->DC).ItemWidthStack;
  v = &(GImGui->CurrentWindow->DC).ItemWidth;
  ImVector<float>::push_back(this,v);
  ImVector<float>::push_back(this,&w_item_last);
  iVar2 = 2;
  if (2 < components) {
    iVar2 = components;
  }
  iVar2 = iVar2 + -2;
  while (bVar4 = iVar2 != 0, iVar2 = iVar2 + -1, bVar4) {
    ImVector<float>::push_back(this,&w_item_one);
  }
  pfVar3 = &w_item_one;
  if (components == 1) {
    pfVar3 = &w_item_last;
  }
  *v = *pfVar3;
  *(byte *)&(pIVar1->NextItemData).Flags = (byte)(pIVar1->NextItemData).Flags & 0xfe;
  return;
}

Assistant:

void ImGui::PushMultiItemsWidths(int components, float w_full)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiStyle& style = g.Style;
    const float w_item_one  = ImMax(1.0f, IM_FLOOR((w_full - (style.ItemInnerSpacing.x) * (components - 1)) / (float)components));
    const float w_item_last = ImMax(1.0f, IM_FLOOR(w_full - (w_item_one + style.ItemInnerSpacing.x) * (components - 1)));
    window->DC.ItemWidthStack.push_back(window->DC.ItemWidth); // Backup current width
    window->DC.ItemWidthStack.push_back(w_item_last);
    for (int i = 0; i < components - 2; i++)
        window->DC.ItemWidthStack.push_back(w_item_one);
    window->DC.ItemWidth = (components == 1) ? w_item_last : w_item_one;
    g.NextItemData.Flags &= ~ImGuiNextItemDataFlags_HasWidth;
}